

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O3

exr_result_t exr_attr_set_v2d(exr_context_t ctxt,int part_index,char *name,exr_attr_v2d_t *val)

{
  exr_attr_box2i_t *peVar1;
  anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 aVar2;
  exr_result_t eVar3;
  code *UNRECOVERED_JUMPTABLE;
  char *pcVar4;
  undefined8 uVar5;
  char *pcVar6;
  exr_attribute_list_t *list;
  exr_attribute_t *attr;
  exr_attribute_t *local_30;
  
  local_30 = (exr_attribute_t *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
    eVar3 = (**(code **)(ctxt + 0x48))
                      (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
    return eVar3;
  }
  if (*ctxt == (_priv_exr_context_t)0x3) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar5 = 0x15;
LAB_0011ba21:
    eVar3 = (*UNRECOVERED_JUMPTABLE)(ctxt,uVar5);
    return eVar3;
  }
  if (*ctxt == (_priv_exr_context_t)0x0) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar5 = 8;
    goto LAB_0011ba21;
  }
  list = (exr_attribute_list_t *)
         (*(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8) + 8);
  eVar3 = exr_attr_list_find_by_name(ctxt,list,name,&local_30);
  if (eVar3 == 0) {
    if (local_30->type != EXR_ATTR_V2D) {
      pcVar6 = local_30->type_name;
      pcVar4 = "\'%s\' requested type \'v2d\', but stored attributes is type \'%s\'";
      uVar5 = 0x10;
      goto LAB_0011bae8;
    }
    if (val != (exr_attr_v2d_t *)0x0) goto LAB_0011baab;
  }
  else {
    if (eVar3 != 0xf) {
      return eVar3;
    }
    if (*ctxt != (_priv_exr_context_t)0x1) {
      return 0xf;
    }
    eVar3 = exr_attr_list_add(ctxt,list,name,EXR_ATTR_V2D,0,(uint8_t **)0x0,&local_30);
    if (val != (exr_attr_v2d_t *)0x0) {
      if (eVar3 != 0) {
        return eVar3;
      }
LAB_0011baab:
      peVar1 = (local_30->field_6).box2i;
      aVar2 = (anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0)(val->field_0).field_0.y;
      (peVar1->min).field_0 = (anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0)(val->field_0).field_0.x
      ;
      (peVar1->max).field_0 = aVar2;
      return 0;
    }
  }
  pcVar4 = "No input value for setting \'%s\', type \'%s\'";
  pcVar6 = "v2d";
  uVar5 = 3;
LAB_0011bae8:
  eVar3 = (**(code **)(ctxt + 0x48))(ctxt,uVar5,pcVar4,name,pcVar6);
  return eVar3;
}

Assistant:

exr_result_t
exr_attr_set_v2d (
    exr_context_t         ctxt,
    int                   part_index,
    const char*           name,
    const exr_attr_v2d_t* val)
{
    ATTR_SET_IMPL_DEREF (EXR_ATTR_V2D, v2d);
}